

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

nodetest_t __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_node_test_type
          (xpath_parser *this,xpath_lexer_string *name)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  
  bVar1 = *(byte *)&this->_alloc;
  if (bVar1 < 0x70) {
    if (bVar1 == 99) {
      lVar3 = (long)name - (long)this;
      if (lVar3 != 0) {
        lVar2 = 0;
        do {
          if ("Error parsing comment"[lVar2 + 0xe] != *(char *)((long)&this->_alloc + lVar2)) {
            return nodetest_none;
          }
          lVar2 = lVar2 + 1;
        } while (lVar3 != lVar2);
      }
      if ("Error parsing comment"[lVar3 + 0xe] == '\0') {
        return nodetest_type_comment;
      }
    }
    else if (bVar1 == 0x6e) {
      lVar3 = (long)name - (long)this;
      if (lVar3 != 0) {
        lVar2 = 0;
        do {
          if ("node"[lVar2] != *(char *)((long)&this->_alloc + lVar2)) {
            return nodetest_none;
          }
          lVar2 = lVar2 + 1;
        } while (lVar3 != lVar2);
      }
      if ("node"[lVar3] == '\0') {
        return nodetest_type_node;
      }
    }
  }
  else if (bVar1 == 0x70) {
    lVar3 = (long)name - (long)this;
    if (lVar3 != 0) {
      lVar2 = 0;
      do {
        if ("processing-instruction"[lVar2] != *(char *)((long)&this->_alloc + lVar2)) {
          return nodetest_none;
        }
        lVar2 = lVar2 + 1;
      } while (lVar3 != lVar2);
    }
    if ("processing-instruction"[lVar3] == '\0') {
      return nodetest_type_pi;
    }
  }
  else if (bVar1 == 0x74) {
    lVar3 = (long)name - (long)this;
    if (lVar3 != 0) {
      lVar2 = 0;
      do {
        if ("text"[lVar2] != *(char *)((long)&this->_alloc + lVar2)) {
          return nodetest_none;
        }
        lVar2 = lVar2 + 1;
      } while (lVar3 != lVar2);
    }
    if ("text"[lVar3] == '\0') {
      return nodetest_type_text;
    }
  }
  return nodetest_none;
}

Assistant:

nodetest_t parse_node_test_type(const xpath_lexer_string& name)
		{
			switch (name.begin[0])
			{
			case 'c':
				if (name == PUGIXML_TEXT("comment"))
					return nodetest_type_comment;

				break;

			case 'n':
				if (name == PUGIXML_TEXT("node"))
					return nodetest_type_node;

				break;

			case 'p':
				if (name == PUGIXML_TEXT("processing-instruction"))
					return nodetest_type_pi;

				break;

			case 't':
				if (name == PUGIXML_TEXT("text"))
					return nodetest_type_text;

				break;
			
			default:
				break;
			}

			return nodetest_none;
		}